

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

_Bool bitset_container_is_subset(bitset_container_t *container1,bitset_container_t *container2)

{
  int32_t i;
  bitset_container_t *container2_local;
  bitset_container_t *container1_local;
  _Bool local_1;
  
  if (((container1->cardinality == -1) || (container2->cardinality == -1)) ||
     (container1->cardinality <= container2->cardinality)) {
    for (i = 0; i < 0x400; i = i + 1) {
      if ((container1->words[i] & container2->words[i]) != container1->words[i]) {
        return false;
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool bitset_container_is_subset(const bitset_container_t *container1,
                          const bitset_container_t *container2) {
    if((container1->cardinality != BITSET_UNKNOWN_CARDINALITY) && (container2->cardinality != BITSET_UNKNOWN_CARDINALITY)) {
        if(container1->cardinality > container2->cardinality) {
            return false;
        }
    }
    for(int32_t i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS; ++i ) {
		if((container1->words[i] & container2->words[i]) != container1->words[i]) {
			return false;
		}
	}
	return true;
}